

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Step::~Step(Step *this)

{
  CFloatFunc2::~CFloatFunc2((CFloatFunc2 *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Step (void) : PreciseFunc2("step", step) {}